

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_core_impl.hpp
# Opt level: O1

bool iutest::UnitTestImpl::ValidateTestPropertyName(string *name)

{
  char **ppcVar1;
  long lVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  char *ban [9];
  undefined8 auStack_58 [9];
  char *local_10;
  
  puVar3 = &DAT_00134010;
  puVar4 = auStack_58;
  for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
    *puVar4 = *puVar3;
    puVar3 = puVar3 + 1;
    puVar4 = puVar4 + 1;
  }
  ppcVar1 = std::
            __find_if<char_const**,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                      (auStack_58,&local_10,name);
  return ppcVar1 == &local_10;
}

Assistant:

static bool ValidateTestPropertyName(const ::std::string& name)
    {
        const char* ban[] = {
            "name", "tests", "failures", "disabled", "skip", "errors", "time", "timestamp", "random_seed"
        };
#if !defined(IUTEST_NO_FUNCTION_TEMPLATE_ORDERING)
        return TestProperty::ValidateName(name, ban);
#else
        return TestProperty::ValidateName(name, ban, ban+IUTEST_PP_COUNTOF(ban));
#endif
    }